

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int get_http_header_len(char *buf,int buflen)

{
  byte bVar1;
  ushort **ppuVar2;
  ulong uVar3;
  
  if (0 < buflen) {
    uVar3 = 0;
    do {
      bVar1 = buf[uVar3];
      if (-1 < (char)bVar1) {
        if (((bVar1 != 10) && (bVar1 != 0xd)) &&
           (ppuVar2 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar2 + (ulong)bVar1 * 2 + 1) & 0x40) == 0)) {
          return -1;
        }
        if (bVar1 == 10 && uVar3 < buflen - 1) {
          if (buf[uVar3 + 1] == '\n') {
            return (int)uVar3 + 2;
          }
        }
        else if (((bVar1 == 0xd && (long)uVar3 < (long)(buflen + -3)) && (buf[uVar3 + 1] == '\n'))
                && ((buf[uVar3 + 2] == '\r' && (buf[uVar3 + 3] == '\n')))) {
          return (int)uVar3 + 4;
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)buflen != uVar3);
  }
  return 0;
}

Assistant:

static int
get_http_header_len(const char *buf, int buflen)
{
	int i;
	for (i = 0; i < buflen; i++) {
		/* Do an unsigned comparison in some conditions below */
		const unsigned char c = (unsigned char)buf[i];

		if ((c < 128) && ((char)c != '\r') && ((char)c != '\n')
		    && !isprint(c)) {
			/* abort scan as soon as one malformed character is found */
			return -1;
		}

		if (i < buflen - 1) {
			if ((buf[i] == '\n') && (buf[i + 1] == '\n')) {
				/* Two newline, no carriage return - not standard compliant,
				 * but it should be accepted */
				return i + 2;
			}
		}

		if (i < buflen - 3) {
			if ((buf[i] == '\r') && (buf[i + 1] == '\n') && (buf[i + 2] == '\r')
			    && (buf[i + 3] == '\n')) {
				/* Two \r\n - standard compliant */
				return i + 4;
			}
		}
	}

	return 0;
}